

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffx.c
# Opt level: O0

void ffx_dispose(ptls_cipher_context_t *_ctx)

{
  ptls_ffx_context_t *ctx;
  ptls_cipher_context_t *_ctx_local;
  
  if (_ctx->do_dispose == ffx_dispose) {
    if (_ctx[1].algo != (st_ptls_cipher_algorithm_t *)0x0) {
      ptls_cipher_free((ptls_cipher_context_t *)_ctx[1].algo);
    }
    _ctx[1].algo = (st_ptls_cipher_algorithm_t *)0x0;
    *(undefined4 *)&_ctx[1].do_dispose = 0;
    _ctx[1].do_init = (_func_void_st_ptls_cipher_context_t_ptr_void_ptr *)0x0;
    _ctx[1].do_transform = (_func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    _ctx[2].algo = (st_ptls_cipher_algorithm_t *)0x0;
    *(undefined1 *)&_ctx[2].do_dispose = 0;
    *(undefined4 *)((long)&_ctx[1].do_dispose + 4) = 0;
    _ctx->do_dispose = (_func_void_st_ptls_cipher_context_t_ptr *)0x0;
    _ctx->do_init = (_func_void_st_ptls_cipher_context_t_ptr_void_ptr *)0x0;
    _ctx->do_transform = (_func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    return;
  }
  __assert_fail("ctx->super.do_dispose == ffx_dispose",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c",0x55
                ,"void ffx_dispose(ptls_cipher_context_t *)");
}

Assistant:

static void ffx_dispose(ptls_cipher_context_t *_ctx)
{
    ptls_ffx_context_t *ctx = (ptls_ffx_context_t *)_ctx;

    assert(ctx->super.do_dispose == ffx_dispose);

    if (ctx->enc_ctx != NULL) {
        ptls_cipher_free(ctx->enc_ctx);
    }

    ctx->enc_ctx = NULL;
    ctx->nb_rounds = 0;
    ctx->byte_length = 0;
    ctx->nb_left = 0;
    ctx->nb_right = 0;
    ctx->mask_last_byte = 0;
    ctx->is_enc = 0;

    ctx->super.do_dispose = NULL;
    ctx->super.do_init = NULL;
    ctx->super.do_transform = NULL;
}